

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O1

void __thiscall
ParserProbModelXML::ConvertToLocalSFActionScope
          (ParserProbModelXML *this,Index sfI,Index aI,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *AValues,Scope *AScope)

{
  pointer pSVar1;
  iterator __position;
  pointer puVar2;
  ulong uVar3;
  ulong uVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> allAValues;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  
  uVar4 = (ulong)sfI;
  pSVar1 = (this->_m_AScopes_Y).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->_m_AScopes_Y).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pSVar1 >> 3) * -0x5555555555555555;
  if (uVar3 < uVar4 || uVar3 - uVar4 == 0) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&AScope->super_SDT,&pSVar1[uVar4].super_SDT);
  IndexTools::JointToIndividualIndices(&local_40,aI,&this->_m_ASizes);
  puVar2 = (AValues->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((AValues->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (AValues->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  puVar2 = (AScope->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((AScope->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    uVar3 = 0;
    do {
      if ((ulong)((long)local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 2) <= (ulong)puVar2[uVar3]) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      __position._M_current =
           (AValues->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (AValues->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)AValues,__position,
                   local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start + puVar2[uVar3]);
      }
      else {
        *__position._M_current =
             local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[puVar2[uVar3]];
        (AValues->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar3 = uVar3 + 1;
      puVar2 = (AScope->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(AScope->super_SDT).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 2));
  }
  if (local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ParserProbModelXML::ConvertToLocalSFActionScope(Index sfI, Index aI, vector<Index>& AValues, Scope& AScope)
{
    try{
        AScope = _m_AScopes_Y.at(sfI);
    }
    catch(E& e)
    {
        e.Print();
    }
        
    vector<Index> allAValues = IndexTools::JointToIndividualIndices(aI, _m_ASizes);
    AValues.clear();
    for(size_t i = 0; i < AScope.size(); i++)
        AValues.push_back(allAValues.at(AScope[i]));
}